

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glx_common.c
# Opt level: O0

XVisualInfo * get_glx_visual(Display *dpy)

{
  XVisualInfo *pXVar1;
  undefined1 local_48 [4];
  int screen;
  int attrib [9];
  XVisualInfo *visinfo;
  Display *dpy_local;
  
  memcpy(local_48,&DAT_00102070,0x24);
  pXVar1 = (XVisualInfo *)(*_epoxy_glXChooseVisual)(dpy,*(undefined4 *)(dpy + 0xe0),local_48);
  if (pXVar1 == (XVisualInfo *)0x0) {
    fprintf(_stderr,"Couldn\'t get an RGBA, double-buffered visual\n");
    exit(1);
  }
  return pXVar1;
}

Assistant:

XVisualInfo *
get_glx_visual(Display *dpy)
{
	XVisualInfo *visinfo;
	int attrib[] = {
		GLX_RGBA,
		GLX_RED_SIZE, 1,
		GLX_GREEN_SIZE, 1,
		GLX_BLUE_SIZE, 1,
		GLX_DOUBLEBUFFER,
		None
	};
	int screen = DefaultScreen(dpy);

	visinfo = glXChooseVisual(dpy, screen, attrib);
	if (visinfo == NULL) {
		fprintf(stderr,
			"Couldn't get an RGBA, double-buffered visual\n");
		exit(1);
	}

	return visinfo;
}